

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImGuiTable * __thiscall ImPool<ImGuiTable>::TryGetMapData(ImPool<ImGuiTable> *this,ImPoolIdx n)

{
  ImGuiStoragePair *pIVar1;
  ImGuiTable *pIVar2;
  
  pIVar1 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[](&(this->Map).Data,n);
  if ((pIVar1->field_1).val_i != -1) {
    pIVar2 = ImVector<ImGuiTable>::operator[](&this->Buf,(pIVar1->field_1).val_i);
    return pIVar2;
  }
  return (ImGuiTable *)0x0;
}

Assistant:

T*          TryGetMapData(ImPoolIdx n)          { int idx = Map.Data[n].val_i; if (idx == -1) return NULL; return GetByIndex(idx); }